

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O2

REF_STATUS
ref_search_distance3(REF_DBL *xyz0,REF_DBL *xyz1,REF_DBL *xyz2,REF_DBL *xyz,REF_DBL *distance)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  REF_STATUS RVar7;
  int iVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  REF_DBL dist;
  REF_DBL normal [3];
  REF_DBL total_normal [3];
  double local_90;
  double local_88;
  double dStack_80;
  double local_78;
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  
  ref_search_xyz_normal(xyz0,xyz1,xyz2,&local_48);
  dVar16 = xyz[2];
  dVar1 = xyz0[2];
  dVar17 = dVar16 - dVar1;
  dVar4 = *xyz;
  dVar14 = xyz[1];
  dVar5 = *xyz0;
  dVar6 = xyz0[1];
  dVar11 = dVar4 - dVar5;
  dVar12 = dVar14 - dVar6;
  dVar13 = dVar17 * local_38 + dVar11 * local_48 + dVar12 * dStack_40;
  local_88 = (dVar11 - dVar13 * local_48) + dVar5;
  dStack_80 = (dVar12 - dVar13 * dStack_40) + dVar6;
  local_78 = (dVar17 - local_38 * dVar13) + dVar1;
  ref_search_xyz_normal(&local_88,xyz1,xyz2,&local_68);
  dVar12 = local_58;
  dVar11 = dStack_60;
  dVar17 = local_68;
  ref_search_xyz_normal(xyz0,&local_88,xyz2,&local_68);
  dVar13 = local_38 * dVar12 + local_48 * dVar17 + dVar11 * dStack_40;
  dVar12 = local_38 * local_58 + local_48 * local_68 + dStack_60 * dStack_40;
  RVar7 = ref_search_xyz_normal(xyz0,xyz1,&local_88,&local_68);
  auVar18._8_8_ = dVar12;
  auVar18._0_8_ = dVar13;
  dVar15 = local_38 * local_58 + local_68 * local_48 + dStack_60 * dStack_40;
  dVar17 = dVar13 + dVar12 + dVar15;
  dVar11 = dVar17 * 1e+20;
  if (dVar11 <= -dVar11) {
    dVar11 = -dVar11;
  }
  if (dVar13 <= -dVar13) {
    dVar13 = -dVar13;
  }
  if (dVar13 < dVar11) {
    if (dVar12 <= -dVar12) {
      dVar12 = -dVar12;
    }
    if (dVar12 < dVar11) {
      dVar12 = dVar15;
      if (dVar15 <= -dVar15) {
        dVar12 = -dVar15;
      }
      if (dVar12 < dVar11) {
        dVar15 = dVar15 / dVar17;
        auVar2._8_4_ = SUB84(dVar17,0);
        auVar2._0_8_ = dVar17;
        auVar2._12_4_ = (int)((ulong)dVar17 >> 0x20);
        auVar18 = divpd(auVar18,auVar2);
        dVar17 = auVar18._0_8_;
        dVar11 = auVar18._8_8_;
        auVar3._8_4_ = (int)-(ulong)(0.0 <= dVar11);
        auVar3._0_8_ = -(ulong)(0.0 <= dVar17);
        auVar3._12_4_ = (int)(-(ulong)(0.0 <= dVar11) >> 0x20);
        iVar8 = movmskpd(RVar7,auVar3);
        if ((0.0 <= dVar15) && (iVar8 == 3)) {
          dVar4 = (*xyz2 * dVar15 + dVar17 * dVar5 + *xyz1 * dVar11) - dVar4;
          dVar14 = (xyz2[1] * dVar15 + dVar6 * dVar17 + xyz1[1] * dVar11) - dVar14;
          dVar16 = (dVar15 * xyz2[2] + dVar1 * dVar17 + dVar11 * xyz1[2]) - dVar16;
          dVar16 = SQRT(dVar16 * dVar16 + dVar4 * dVar4 + dVar14 * dVar14);
          goto LAB_00192f8a;
        }
      }
    }
  }
  ref_search_distance2(xyz0,xyz1,xyz,&local_90);
  dVar16 = local_90;
  *distance = local_90;
  ref_search_distance2(xyz1,xyz2,xyz,&local_90);
  uVar9 = SUB84(dVar16,0);
  uVar10 = (undefined4)((ulong)dVar16 >> 0x20);
  if (local_90 <= dVar16) {
    uVar9 = SUB84(local_90,0);
    uVar10 = (undefined4)((ulong)local_90 >> 0x20);
  }
  *distance = (REF_DBL)CONCAT44(uVar10,uVar9);
  ref_search_distance2(xyz2,xyz0,xyz,&local_90);
  dVar16 = (double)CONCAT44(uVar10,uVar9);
  if (local_90 <= (double)CONCAT44(uVar10,uVar9)) {
    dVar16 = local_90;
  }
LAB_00192f8a:
  *distance = dVar16;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_search_distance3(REF_DBL *xyz0, REF_DBL *xyz1,
                                        REF_DBL *xyz2, REF_DBL *xyz,
                                        REF_DBL *distance) {
  REF_DBL dist;
  REF_DBL bary[3], total, total_normal[3], normal[3];
  REF_DBL dxyz[3];
  REF_DBL xyzp[3];

  RSS(ref_search_xyz_normal(xyz0, xyz1, xyz2, total_normal), "n0");

  /* projects query point to triangle plane */
  xyzp[0] = xyz[0] - xyz0[0];
  xyzp[1] = xyz[1] - xyz0[1];
  xyzp[2] = xyz[2] - xyz0[2];
  total = ref_math_dot(xyzp, total_normal);
  xyzp[0] -= total_normal[0] * total;
  xyzp[1] -= total_normal[1] * total;
  xyzp[2] -= total_normal[2] * total;
  xyzp[0] += xyz0[0];
  xyzp[1] += xyz0[1];
  xyzp[2] += xyz0[2];

  RSS(ref_search_xyz_normal(xyzp, xyz1, xyz2, normal), "n0");
  bary[0] = ref_math_dot(normal, total_normal);
  RSS(ref_search_xyz_normal(xyz0, xyzp, xyz2, normal), "n1");
  bary[1] = ref_math_dot(normal, total_normal);
  RSS(ref_search_xyz_normal(xyz0, xyz1, xyzp, normal), "n2");
  bary[2] = ref_math_dot(normal, total_normal);

  total = bary[0] + bary[1] + bary[2];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total) &&
      ref_math_divisible(bary[2], total)) {
    bary[0] /= total;
    bary[1] /= total;
    bary[2] /= total;
    if (bary[0] >= 0.0 && bary[1] >= 0.0 && bary[2] >= 0.0) {
      dxyz[0] =
          bary[0] * xyz0[0] + bary[1] * xyz1[0] + bary[2] * xyz2[0] - xyz[0];
      dxyz[1] =
          bary[0] * xyz0[1] + bary[1] * xyz1[1] + bary[2] * xyz2[1] - xyz[1];
      dxyz[2] =
          bary[0] * xyz0[2] + bary[1] * xyz1[2] + bary[2] * xyz2[2] - xyz[2];
      *distance = sqrt(ref_math_dot(dxyz, dxyz));
      return REF_SUCCESS;
    }
  }

  RSS(ref_search_distance2(xyz0, xyz1, xyz, &dist), "e01");
  *distance = dist;
  RSS(ref_search_distance2(xyz1, xyz2, xyz, &dist), "e12");
  *distance = MIN(*distance, dist);
  RSS(ref_search_distance2(xyz2, xyz0, xyz, &dist), "e20");
  *distance = MIN(*distance, dist);

  return REF_SUCCESS;
}